

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * wasm::saturating_narrow<unsigned_char>(Literal *__return_storage_ptr__,type val)

{
  byte bVar1;
  undefined2 local_12;
  type val_local;
  
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if ((short)(ushort)bVar1 < val) {
    bVar1 = std::numeric_limits<unsigned_char>::max();
    local_12 = (ushort)bVar1;
  }
  else {
    bVar1 = std::numeric_limits<unsigned_char>::min();
    local_12 = val;
    if (val < (short)(ushort)bVar1) {
      bVar1 = std::numeric_limits<unsigned_char>::min();
      local_12 = (ushort)bVar1;
    }
  }
  Literal::Literal(__return_storage_ptr__,(int)(short)local_12);
  return __return_storage_ptr__;
}

Assistant:

Literal saturating_narrow(
  typename TwiceWidth<typename std::make_signed<T>::type>::type val) {
  using WideT = typename TwiceWidth<typename std::make_signed<T>::type>::type;
  if (val > WideT(std::numeric_limits<T>::max())) {
    val = std::numeric_limits<T>::max();
  } else if (val < WideT(std::numeric_limits<T>::min())) {
    val = std::numeric_limits<T>::min();
  }
  return Literal(int32_t(val));
}